

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pShaderOptimizationTests.cpp
# Opt level: O3

ProgramData * __thiscall
deqp::gles3::Performance::anon_unknown_1::LoopUnrollCase::generateProgramData
          (ProgramData *__return_storage_ptr__,LoopUnrollCase *this,bool optimized)

{
  uint uVar1;
  int numRepeats;
  CaseShaderType shaderType;
  undefined8 *puVar2;
  long *plVar3;
  mapped_type *pmVar4;
  undefined8 uVar5;
  size_type *psVar6;
  ulong *puVar7;
  char *pcVar8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar9;
  undefined7 in_register_00000011;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *unaff_RBX;
  char *unaff_RBP;
  _Alloc_hider _Var10;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *unaff_R12;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *unaff_R13;
  size_type __dnew;
  string repetition;
  size_type __dnew_2;
  string local_2e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_2c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_2c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2b8;
  string local_2a8;
  string local_288;
  undefined4 *local_268;
  undefined8 local_260;
  undefined4 local_258;
  undefined1 uStack_254;
  undefined1 uStack_253;
  undefined2 uStack_252;
  string local_248;
  string local_228;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_208;
  undefined8 local_200;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1f8;
  key_type local_1e8;
  StringTemplate local_1c8;
  undefined1 local_1a8 [32];
  _Base_ptr local_188;
  size_t local_180;
  ios_base local_138 [264];
  
  if ((int)CONCAT71(in_register_00000011,optimized) == 0) {
    uVar1 = this->m_numRepetitions;
    unaff_RBP = (char *)(ulong)uVar1;
    local_288._M_dataplus._M_p = (pointer)&local_288.field_2;
    if (this->m_caseType == CASETYPE_DEPENDENT) {
      local_1a8._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)0x12;
      local_288._M_dataplus._M_p =
           (pointer)std::__cxx11::string::_M_create((ulong *)&local_288,(ulong)local_1a8);
      *(undefined8 *)local_288._M_dataplus._M_p = 0x203d2065756c6176;
      *(undefined8 *)((long)local_288._M_dataplus._M_p + 8) = 0x756c6176286e6973;
      *(undefined2 *)((long)local_288._M_dataplus._M_p + 0x10) = 0x2965;
    }
    else {
      if (this->m_caseType != CASETYPE_INDEPENDENT) goto LAB_006bc0b4;
      local_1a8._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)0x27;
      local_288._M_dataplus._M_p =
           (pointer)std::__cxx11::string::_M_create((ulong *)&local_288,(ulong)local_1a8);
      *(undefined8 *)((long)local_288._M_dataplus._M_p + 0x10) = 0x58444e7b24287461;
      *(undefined8 *)((long)local_288._M_dataplus._M_p + 0x18) = 0x6c61762a29312b7d;
      *(undefined8 *)local_288._M_dataplus._M_p = 0x3d2b2065756c6176;
      *(undefined8 *)((long)local_288._M_dataplus._M_p + 8) = 0x6f6c66286e697320;
      builtin_strncpy((char *)((long)local_288._M_dataplus._M_p + 0x1f),"lueOrig)",8);
    }
    local_288._M_dataplus._M_p[local_1a8._0_8_] = '\0';
    local_288._M_string_length = local_1a8._0_8_;
    local_288.field_2._M_allocated_capacity = local_1a8._0_8_;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    std::ostream::operator<<(local_1a8,uVar1);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base(local_138);
    puVar2 = (undefined8 *)std::__cxx11::string::replace((ulong)&local_268,0,(char *)0x0,0xb2b881);
    psVar6 = puVar2 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar2 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar6) {
      local_2a8.field_2._M_allocated_capacity = *psVar6;
      local_2a8.field_2._8_8_ = puVar2[3];
      local_2a8._M_dataplus._M_p = (pointer)&local_2a8.field_2;
    }
    else {
      local_2a8.field_2._M_allocated_capacity = *psVar6;
      local_2a8._M_dataplus._M_p = (pointer)*puVar2;
    }
    local_2a8._M_string_length = puVar2[1];
    *puVar2 = psVar6;
    puVar2[1] = 0;
    *(undefined1 *)(puVar2 + 2) = 0;
    puVar2 = (undefined8 *)std::__cxx11::string::append((char *)&local_2a8);
    pcVar8 = (char *)(puVar2 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar2 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar8) {
      local_2b8._M_allocated_capacity = *(undefined8 *)pcVar8;
      local_2b8._8_8_ = puVar2[3];
      local_2c8 = &local_2b8;
    }
    else {
      local_2b8._M_allocated_capacity = *(undefined8 *)pcVar8;
      local_2c8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*puVar2;
    }
    local_2c0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)puVar2[1];
    *puVar2 = pcVar8;
    puVar2[1] = 0;
    *(undefined1 *)(puVar2 + 2) = 0;
    tcu::StringTemplate::StringTemplate(&local_1c8,&local_288);
    unaff_R12 = &local_1e8.field_2;
    local_1e8.field_2._M_allocated_capacity._0_4_ = 0x58444e;
    local_1e8._M_string_length = 3;
    unaff_R13 = &local_1f8;
    local_1f8._M_allocated_capacity._0_2_ = 0x69;
    local_200 = 1;
    local_1a8._8_8_ = (ulong)(uint)local_1a8._12_4_ << 0x20;
    local_1a8._16_8_ = 0;
    local_180 = 0;
    local_208 = unaff_R13;
    local_1e8._M_dataplus._M_p = (pointer)unaff_R12;
    local_1a8._24_8_ = (_Base_ptr)(local_1a8 + 8);
    local_188 = (_Base_ptr)(local_1a8 + 8);
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)local_1a8,&local_1e8);
    std::__cxx11::string::_M_assign((string *)pmVar4);
    tcu::StringTemplate::specialize
              (&local_228,&local_1c8,
               (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)local_1a8);
    uVar5 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0xf;
    if (local_2c8 != &local_2b8) {
      uVar5 = local_2b8._M_allocated_capacity;
    }
    if ((ulong)uVar5 < local_2c0->_M_local_buf + local_228._M_string_length) {
      uVar5 = (char *)0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_228._M_dataplus._M_p != &local_228.field_2) {
        uVar5 = local_228.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar5 < local_2c0->_M_local_buf + local_228._M_string_length) goto LAB_006bbcaa;
      puVar2 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_228,0,(char *)0x0,(ulong)local_2c8);
    }
    else {
LAB_006bbcaa:
      puVar2 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_2c8,(ulong)local_228._M_dataplus._M_p)
      ;
    }
    local_2e8._M_dataplus._M_p = (pointer)&local_2e8.field_2;
    psVar6 = puVar2 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar2 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar6) {
      local_2e8.field_2._M_allocated_capacity = *psVar6;
      local_2e8.field_2._8_8_ = puVar2[3];
    }
    else {
      local_2e8.field_2._M_allocated_capacity = *psVar6;
      local_2e8._M_dataplus._M_p = (pointer)*puVar2;
    }
    local_2e8._M_string_length = puVar2[1];
    *puVar2 = psVar6;
    puVar2[1] = 0;
    *(undefined1 *)psVar6 = 0;
    plVar3 = (long *)std::__cxx11::string::append((char *)&local_2e8);
    local_248._M_dataplus._M_p = (pointer)&local_248.field_2;
    psVar6 = (size_type *)(plVar3 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar3 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar6) {
      local_248.field_2._M_allocated_capacity = *psVar6;
      local_248.field_2._8_8_ = plVar3[3];
    }
    else {
      local_248.field_2._M_allocated_capacity = *psVar6;
      local_248._M_dataplus._M_p = (pointer)*plVar3;
    }
    local_248._M_string_length = plVar3[1];
    *plVar3 = (long)psVar6;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2e8._M_dataplus._M_p != &local_2e8.field_2) {
      operator_delete(local_2e8._M_dataplus._M_p,local_2e8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_228._M_dataplus._M_p != &local_228.field_2) {
      operator_delete(local_228._M_dataplus._M_p,
                      (ulong)(local_228.field_2._M_allocated_capacity + 1));
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)local_1a8);
    if (local_208 != unaff_R13) {
      operator_delete(local_208,
                      CONCAT62(local_1f8._M_allocated_capacity._2_6_,
                               local_1f8._M_allocated_capacity._0_2_) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e8._M_dataplus._M_p != unaff_R12) {
      operator_delete(local_1e8._M_dataplus._M_p,
                      CONCAT44(local_1e8.field_2._M_allocated_capacity._4_4_,
                               local_1e8.field_2._M_allocated_capacity._0_4_) + 1);
    }
    tcu::StringTemplate::~StringTemplate(&local_1c8);
    if (local_2c8 != &local_2b8) {
      operator_delete(local_2c8,(ulong)(local_2b8._M_allocated_capacity + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
      operator_delete(local_2a8._M_dataplus._M_p,local_2a8.field_2._M_allocated_capacity + 1);
    }
    unaff_RBX = &local_288.field_2;
    if (local_268 != &local_258) {
      operator_delete(local_268,
                      CONCAT26(uStack_252,CONCAT15(uStack_253,CONCAT14(uStack_254,local_258))) + 1);
    }
    uVar5 = local_288.field_2._M_allocated_capacity;
    _Var10._M_p = local_288._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_288._M_dataplus._M_p != unaff_RBX) {
LAB_006bbe69:
      operator_delete(_Var10._M_p,(ulong)(uVar5 + 1));
    }
LAB_006bbe71:
    shaderType = (this->super_ShaderOptimizationCase).m_caseShaderType;
    unaff_RBP = (char *)(ulong)shaderType;
    local_268 = &local_258;
    if (shaderType < CASESHADERTYPE_LAST) {
      uStack_254 = 0x70;
      local_258 = 0x68676968;
      local_260 = 5;
      uStack_253 = 0;
      plVar3 = (long *)std::__cxx11::string::replace((ulong)&local_268,0,(char *)0x0,0xb384b6);
      psVar6 = (size_type *)(plVar3 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar3 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar6) {
        local_2a8.field_2._M_allocated_capacity = *psVar6;
        local_2a8.field_2._8_8_ = plVar3[3];
        local_2a8._M_dataplus._M_p = (pointer)&local_2a8.field_2;
      }
      else {
        local_2a8.field_2._M_allocated_capacity = *psVar6;
        local_2a8._M_dataplus._M_p = (pointer)*plVar3;
      }
      local_2a8._M_string_length = plVar3[1];
      *plVar3 = (long)psVar6;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
      plVar3 = (long *)std::__cxx11::string::append((char *)&local_2a8);
      paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(plVar3 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar3 == paVar9) {
        local_2b8._M_allocated_capacity = paVar9->_M_allocated_capacity;
        local_2b8._8_8_ = plVar3[3];
        local_2c8 = &local_2b8;
      }
      else {
        local_2b8._M_allocated_capacity = paVar9->_M_allocated_capacity;
        local_2c8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*plVar3;
      }
      local_2c0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)plVar3[1];
      *plVar3 = (long)paVar9;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
      plVar3 = (long *)std::__cxx11::string::_M_append
                                 ((char *)&local_2c8,(ulong)local_248._M_dataplus._M_p);
      psVar6 = (size_type *)(plVar3 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar3 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar6) {
        local_2e8.field_2._M_allocated_capacity = *psVar6;
        local_2e8.field_2._8_8_ = plVar3[3];
        local_2e8._M_dataplus._M_p = (pointer)&local_2e8.field_2;
      }
      else {
        local_2e8.field_2._M_allocated_capacity = *psVar6;
        local_2e8._M_dataplus._M_p = (pointer)*plVar3;
      }
      local_2e8._M_string_length = plVar3[1];
      *plVar3 = (long)psVar6;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
      local_1a8._8_8_ = 0;
      local_1a8._16_8_ = local_1a8._16_8_ & 0xffffffffffffff00;
      local_1a8._0_8_ = local_1a8 + 0x10;
      defaultProgramData(__return_storage_ptr__,shaderType,(string *)local_1a8,&local_2e8);
      if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
        operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2e8._M_dataplus._M_p != &local_2e8.field_2) {
        operator_delete(local_2e8._M_dataplus._M_p,local_2e8.field_2._M_allocated_capacity + 1);
      }
      if (local_2c8 != &local_2b8) {
        operator_delete(local_2c8,local_2b8._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
        operator_delete(local_2a8._M_dataplus._M_p,local_2a8.field_2._M_allocated_capacity + 1);
      }
      if (local_268 != &local_258) {
        operator_delete(local_268,
                        CONCAT26(uStack_252,CONCAT15(uStack_253,CONCAT14(uStack_254,local_258))) + 1
                       );
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_248._M_dataplus._M_p != &local_248.field_2) {
        operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
      }
      return __return_storage_ptr__;
    }
    std::__throw_logic_error("basic_string::_M_construct null not valid");
  }
  else {
    unaff_RBX = &local_2b8;
    local_2c8 = unaff_RBX;
    if (this->m_caseType == CASETYPE_DEPENDENT) {
      local_2a8._M_dataplus._M_p = (pointer)0x12;
      local_2c8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)std::__cxx11::string::_M_create((ulong *)&local_2c8,(ulong)&local_2a8);
      local_2c8->_M_allocated_capacity = 0x203d2065756c6176;
      (&local_2c8->_M_allocated_capacity)[1] = 0x756c6176286e6973;
      *(undefined2 *)(&local_2c8->_M_allocated_capacity + 2) = 0x2965;
LAB_006bb8d4:
      local_2c8->_M_local_buf[(long)local_2a8._M_dataplus._M_p] = '\0';
      local_2c0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_2a8._M_dataplus._M_p;
      local_2b8._M_allocated_capacity = (size_type)local_2a8._M_dataplus._M_p;
      puVar2 = (undefined8 *)std::__cxx11::string::replace((ulong)&local_2c8,0,(char *)0x0,0xb384b6)
      ;
      psVar6 = puVar2 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar2 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar6) {
        local_2e8.field_2._M_allocated_capacity = *psVar6;
        local_2e8.field_2._8_8_ = puVar2[3];
        local_2e8._M_dataplus._M_p = (pointer)&local_2e8.field_2;
      }
      else {
        local_2e8.field_2._M_allocated_capacity = *psVar6;
        local_2e8._M_dataplus._M_p = (pointer)*puVar2;
      }
      local_2e8._M_string_length = puVar2[1];
      *puVar2 = psVar6;
      puVar2[1] = 0;
      *(undefined1 *)(puVar2 + 2) = 0;
      plVar3 = (long *)std::__cxx11::string::append((char *)&local_2e8);
      unaff_R12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(local_1a8 + 0x10);
      local_1a8._0_8_ = *plVar3;
      puVar7 = (ulong *)(plVar3 + 2);
      if ((ulong *)local_1a8._0_8_ == puVar7) {
        local_1a8._16_8_ = *puVar7;
        local_1a8._24_8_ = plVar3[3];
        local_1a8._0_8_ = unaff_R12;
      }
      else {
        local_1a8._16_8_ = *puVar7;
      }
      local_1a8._8_8_ = plVar3[1];
      *plVar3 = (long)puVar7;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
      numRepeats = this->m_numRepetitions;
      unaff_R13 = &local_2a8.field_2;
      local_2a8._M_dataplus._M_p = (pointer)unaff_R13;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_2a8,"");
      repeatIndexedTemplate(&local_248,(string *)local_1a8,numRepeats,&local_2a8,0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2a8._M_dataplus._M_p != unaff_R13) {
        operator_delete(local_2a8._M_dataplus._M_p,local_2a8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a8._0_8_ != unaff_R12) {
        operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2e8._M_dataplus._M_p != &local_2e8.field_2) {
        operator_delete(local_2e8._M_dataplus._M_p,local_2e8.field_2._M_allocated_capacity + 1);
      }
      uVar5 = local_2b8._M_allocated_capacity;
      _Var10._M_p = (pointer)local_2c8;
      if (local_2c8 != unaff_RBX) goto LAB_006bbe69;
      goto LAB_006bbe71;
    }
    if (this->m_caseType == CASETYPE_INDEPENDENT) {
      local_2a8._M_dataplus._M_p = (pointer)0x27;
      local_2c8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)std::__cxx11::string::_M_create((ulong *)&local_2c8,(ulong)&local_2a8);
      local_2c8->_M_allocated_capacity = 0x3d2b2065756c6176;
      (&local_2c8->_M_allocated_capacity)[1] = 0x6f6c66286e697320;
      (&local_2c8->_M_allocated_capacity)[2] = 0x58444e7b24287461;
      (&local_2c8->_M_allocated_capacity)[3] = 0x6c61762a29312b7d;
      builtin_strncpy((char *)((long)local_2c8 + 0x1f),"lueOrig)",8);
      goto LAB_006bb8d4;
    }
  }
  std::__throw_logic_error("basic_string::_M_construct null not valid");
LAB_006bc0b4:
  uVar5 = std::__throw_logic_error("basic_string::_M_construct null not valid");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2e8._M_dataplus._M_p != &local_2e8.field_2) {
    operator_delete(local_2e8._M_dataplus._M_p,local_2e8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_228._M_dataplus._M_p != &local_228.field_2) {
    operator_delete(local_228._M_dataplus._M_p,(ulong)(local_228.field_2._M_allocated_capacity + 1))
    ;
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)local_1a8);
  if (local_208 != unaff_R13) {
    operator_delete(local_208,
                    CONCAT62(local_1f8._M_allocated_capacity._2_6_,
                             local_1f8._M_allocated_capacity._0_2_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_dataplus._M_p != unaff_R12) {
    operator_delete(local_1e8._M_dataplus._M_p,
                    CONCAT44(local_1e8.field_2._M_allocated_capacity._4_4_,
                             local_1e8.field_2._M_allocated_capacity._0_4_) + 1);
  }
  tcu::StringTemplate::~StringTemplate(&local_1c8);
  if (local_2c8 !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)unaff_RBP) {
    operator_delete(local_2c8,(ulong)(local_2b8._M_allocated_capacity + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a8._M_dataplus._M_p != unaff_RBX) {
    operator_delete(local_2a8._M_dataplus._M_p,local_2a8.field_2._M_allocated_capacity + 1);
  }
  if (local_268 != &local_258) {
    operator_delete(local_268,
                    CONCAT26(uStack_252,CONCAT15(uStack_253,CONCAT14(uStack_254,local_258))) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_288._M_dataplus._M_p != &local_288.field_2) {
    operator_delete(local_288._M_dataplus._M_p,(ulong)(local_288.field_2._M_allocated_capacity + 1))
    ;
  }
  _Unwind_Resume(uVar5);
}

Assistant:

ProgramData generateProgramData (bool optimized) const
	{
		const string repetition = optimized ? repeatIndexedTemplate("\t" + expressionTemplate(m_caseType) + ";\n", m_numRepetitions)
											: loop(m_numRepetitions, expressionTemplate(m_caseType));

		return defaultProgramData(m_caseShaderType, "\t" + getShaderPrecision(m_caseShaderType) + " vec4 valueOrig = value;\n" + repetition);
	}